

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> * __thiscall
anon_unknown.dwarf_33c573::BuildEngineImpl::findCycle
          (vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>
           *__return_storage_ptr__,BuildEngineImpl *this,KeyType *buildKey)

{
  pointer *this_00;
  uint uVar1;
  initializer_list<WorkItem> __l;
  value_type this_01;
  bool bVar2;
  char *key;
  reference ppVar3;
  vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
  *this_02;
  vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
  *pvVar4;
  reference ppVar5;
  reference ppRVar6;
  KeyType *this_03;
  reference __k;
  mapped_type *pmVar7;
  reference ppVar8;
  iterator iVar9;
  iterator iVar10;
  RuleInfo *pRVar11;
  pointer node_00;
  reference __k_00;
  size_type sVar12;
  const_reference ppRVar13;
  pair<std::__detail::_Node_iterator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_true,_false>,_bool>
  pVar14;
  pair<std::__detail::_Node_iterator<llbuild::core::Rule_*,_true,_false>,_bool> pVar15;
  byte local_3d9;
  WorkItem local_3b0;
  Rule *local_3a0;
  Rule *child;
  undefined1 local_390;
  _Node_iterator_base<llbuild::core::Rule_*,_false> local_388;
  pair<std::__detail::_Node_iterator<llbuild::core::Rule_*,_true,_false>,_bool> it_2;
  mapped_type *predecessors;
  value_type *entry_2;
  WorkItem local_360;
  iterator local_350;
  size_type local_348;
  undefined1 local_340 [8];
  vector<WorkItem,_std::allocator<WorkItem>_> stack;
  unordered_set<llbuild::core::Rule_*,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<llbuild::core::Rule_*>_>
  cycleItems;
  pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>
  *entry_1;
  iterator __end2_3;
  iterator __begin2_3;
  unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
  *__range2_3;
  Rule **succ;
  iterator __end3_4;
  iterator __begin3_4;
  vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *__range3_4;
  Rule *node;
  pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>
  *entry;
  iterator __end2_2;
  iterator __begin2_2;
  unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
  *__range2_2;
  unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
  predecessorGraph;
  pointer local_230;
  pointer local_228;
  reference local_220;
  RuleScanRequest *request_3;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
  *__range3_3;
  pointer local_1f8;
  reference local_1f0;
  TaskInputRequest *request_2;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
  *__range3_2;
  value_type local_1b0;
  RuleScanRecord *record;
  unordered_set<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::hash<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>,_std::equal_to<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
  visitedRuleScanRecords;
  RuleScanRecord *scanRecord;
  RuleInfo *ruleInfo;
  pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo> *it_1;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_map<llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo,_std::hash<llbuild::core::KeyID>,_std::equal_to<llbuild::core::KeyID>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>_>
  *__range2_1;
  pointer local_130;
  pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>
  local_128;
  pointer local_108;
  reference local_100;
  RuleScanRequest *request_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
  *__range3_1;
  reference local_d8;
  TaskInputRequest *request;
  const_iterator __end3;
  const_iterator __begin3;
  vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
  *__range3;
  vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> successors;
  TaskInfo *taskInfo;
  pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo> *it;
  iterator __end2;
  iterator __begin2;
  unordered_map<llbuild::core::Task_*,_(anonymous_namespace)::BuildEngineImpl::TaskInfo,_std::hash<llbuild::core::Task_*>,_std::equal_to<llbuild::core::Task_*>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>_>
  *__range2;
  vector<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
  activeRuleScanRecords;
  unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
  successorGraph;
  TracingEngineQueueItemEvent i;
  KeyType *buildKey_local;
  BuildEngineImpl *this_local;
  vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *cycleList;
  
  key = llbuild::core::KeyType::c_str(buildKey);
  llbuild::TracingEngineQueueItemEvent::TracingEngineQueueItemEvent
            ((TracingEngineQueueItemEvent *)&successorGraph._M_h._M_single_bucket,FindingCycle,key);
  std::
  unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
  ::unordered_map((unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
                   *)&activeRuleScanRecords.
                      super__Vector_base<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
  ::vector((vector<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
            *)&__range2);
  __end2 = std::
           unordered_map<llbuild::core::Task_*,_(anonymous_namespace)::BuildEngineImpl::TaskInfo,_std::hash<llbuild::core::Task_*>,_std::equal_to<llbuild::core::Task_*>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>_>
           ::begin(&this->taskInfos);
  it = (pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo> *)
       std::
       unordered_map<llbuild::core::Task_*,_(anonymous_namespace)::BuildEngineImpl::TaskInfo,_std::hash<llbuild::core::Task_*>,_std::equal_to<llbuild::core::Task_*>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>_>
       ::end(&this->taskInfos);
  while (bVar2 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
                            ,(_Node_iterator_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
                              *)&it), bVar2) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false,_false>
             ::operator*(&__end2);
    successors.super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&ppVar3->second;
    if ((ppVar3->second).forRuleInfo == (RuleInfo *)0x0) {
      __assert_fail("taskInfo.forRuleInfo",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                    ,0x453,
                    "std::vector<Rule *> (anonymous namespace)::BuildEngineImpl::findCycle(const KeyType &)"
                   );
    }
    std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::vector
              ((vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *)&__range3);
    this_02 = (vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
               *)(successors.
                  super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    __end3 = std::
             vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
             ::begin(this_02);
    request = (TaskInputRequest *)
              std::
              vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
              ::end(this_02);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
                                       *)&request), bVar2) {
      local_d8 = __gnu_cxx::
                 __normal_iterator<const_(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
                 ::operator*(&__end3);
      if (local_d8->taskInfo->forRuleInfo == (RuleInfo *)0x0) {
        __assert_fail("request.taskInfo->forRuleInfo",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                      ,0x456,
                      "std::vector<Rule *> (anonymous namespace)::BuildEngineImpl::findCycle(const KeyType &)"
                     );
      }
      __range3_1 = (vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                    *)std::
                      unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                      get(&local_d8->taskInfo->forRuleInfo->rule);
      std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::push_back
                ((vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *)&__range3,
                 (value_type *)&__range3_1);
      __gnu_cxx::
      __normal_iterator<const_(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
      ::operator++(&__end3);
    }
    pvVar4 = (vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
              *)(successors.
                 super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    __end3_1 = std::
               vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
               ::begin(pvVar4);
    request_1 = (RuleScanRequest *)
                std::
                vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                ::end(pvVar4);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>_>
                               *)&request_1), bVar2) {
      local_100 = __gnu_cxx::
                  __normal_iterator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>_>
                  ::operator*(&__end3_1);
      local_108 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                  get(&local_100->ruleInfo->rule);
      std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::push_back
                ((vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *)&__range3,
                 &local_108);
      __gnu_cxx::
      __normal_iterator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>_>
      ::operator++(&__end3_1);
    }
    local_130 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::get
                          ((unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                            *)&successors.
                               super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage[7]->key);
    std::
    pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>
    ::
    pair<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_&,_true>
              (&local_128,&local_130,
               (vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *)&__range3);
    std::
    unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
    ::insert((unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
              *)&activeRuleScanRecords.
                 super__Vector_base<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_128);
    std::
    pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>
    ::~pair(&local_128);
    std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::~vector
              ((vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *)&__range3);
    std::__detail::
    _Node_iterator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false,_false>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             unordered_map<llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo,_std::hash<llbuild::core::KeyID>,_std::equal_to<llbuild::core::KeyID>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>_>
             ::begin(&this->ruleInfos);
  it_1 = (pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo> *)
         std::
         unordered_map<llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo,_std::hash<llbuild::core::KeyID>,_std::equal_to<llbuild::core::KeyID>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>_>
         ::end(&this->ruleInfos);
  while (bVar2 = std::__detail::operator!=
                           (&__end2_1.
                             super__Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                            ,(_Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                              *)&it_1), bVar2) {
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_false,_true>
             ::operator*(&__end2_1);
    bVar2 = RuleInfo::isScanning(&ppVar5->second);
    if (bVar2) {
      visitedRuleScanRecords._M_h._M_single_bucket =
           (__node_base_ptr)RuleInfo::getPendingScanRecord(&ppVar5->second);
      std::
      vector<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
      ::push_back((vector<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                   *)&__range2,(value_type *)&visitedRuleScanRecords._M_h._M_single_bucket);
    }
    std::__detail::
    _Node_iterator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_false,_true>
    ::operator++(&__end2_1);
  }
  std::
  unordered_set<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::hash<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>,_std::equal_to<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
  ::unordered_set((unordered_set<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::hash<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>,_std::equal_to<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                   *)&record);
  while (bVar2 = std::
                 vector<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                 ::empty((vector<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                          *)&__range2), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppRVar6 = std::
              vector<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
              ::back((vector<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                      *)&__range2);
    local_1b0 = *ppRVar6;
    std::
    vector<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
    ::pop_back((vector<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                *)&__range2);
    pVar14 = std::
             unordered_set<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::hash<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>,_std::equal_to<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
             ::insert((unordered_set<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::hash<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>,_std::equal_to<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                       *)&record,&local_1b0);
    this_01 = local_1b0;
    if (((pVar14.second ^ 0xffU) & 1) == 0) {
      __end3_2 = std::
                 vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                 ::begin(&local_1b0->pausedInputRequests);
      request_2 = (TaskInputRequest *)
                  std::
                  vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                  ::end(&this_01->pausedInputRequests);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_2,
                                (__normal_iterator<const_(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
                                 *)&request_2), bVar2) {
        local_1f0 = __gnu_cxx::
                    __normal_iterator<const_(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
                    ::operator*(&__end3_2);
        if (local_1f0->taskInfo != (TaskInfo *)0x0) {
          local_1f8 = std::
                      unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                      get(&local_1f0->inputRuleInfo->rule);
          pmVar7 = std::
                   unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
                   ::operator[]((unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
                                 *)&activeRuleScanRecords.
                                    super__Vector_base<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1f8);
          __range3_3 = (vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                        *)std::
                          unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                          ::get(&local_1f0->taskInfo->forRuleInfo->rule);
          std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::push_back
                    (pmVar7,(value_type *)&__range3_3);
        }
        __gnu_cxx::
        __normal_iterator<const_(anonymous_namespace)::BuildEngineImpl::TaskInputRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>_>
        ::operator++(&__end3_2);
      }
      pvVar4 = &local_1b0->deferredScanRequests;
      __end3_3 = std::
                 vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                 ::begin(pvVar4);
      request_3 = (RuleScanRequest *)
                  std::
                  vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                  ::end(pvVar4);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_3,
                                (__normal_iterator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>_>
                                 *)&request_3), bVar2) {
        local_220 = __gnu_cxx::
                    __normal_iterator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>_>
                    ::operator*(&__end3_3);
        local_228 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                    ::get(&local_220->inputRuleInfo->rule);
        pmVar7 = std::
                 unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
                 ::operator[]((unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
                               *)&activeRuleScanRecords.
                                  super__Vector_base<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_228);
        local_230 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                    ::get(&local_220->ruleInfo->rule);
        std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::push_back
                  (pmVar7,&local_230);
        bVar2 = RuleInfo::isScanning(local_220->ruleInfo);
        local_3d9 = 1;
        if (!bVar2) {
          local_3d9 = local_220->ruleInfo->wasForced;
        }
        if ((local_3d9 & 1) == 0) {
          __assert_fail("request.ruleInfo->isScanning() || request.ruleInfo->wasForced",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                        ,0x484,
                        "std::vector<Rule *> (anonymous namespace)::BuildEngineImpl::findCycle(const KeyType &)"
                       );
        }
        bVar2 = RuleInfo::isScanning(local_220->ruleInfo);
        if (bVar2) {
          predecessorGraph._M_h._M_single_bucket =
               (__node_base_ptr)RuleInfo::getPendingScanRecord(local_220->ruleInfo);
          std::
          vector<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
          ::push_back((vector<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                       *)&__range2,(value_type *)&predecessorGraph._M_h._M_single_bucket);
        }
        __gnu_cxx::
        __normal_iterator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRequest_*,_std::vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>_>
        ::operator++(&__end3_3);
      }
    }
  }
  std::
  unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
  ::unordered_map((unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
                   *)&__range2_2);
  this_00 = &activeRuleScanRecords.
             super__Vector_base<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end2_2 = std::
             unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
             ::begin((unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
                      *)this_00);
  entry = (pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>
           *)std::
             unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
             ::end((unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
                    *)this_00);
  while (bVar2 = std::__detail::operator!=
                           (&__end2_2.
                             super__Node_iterator_base<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>,_false>
                            ,(_Node_iterator_base<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>,_false>
                              *)&entry), bVar2) {
    node = (Rule *)std::__detail::
                   _Node_iterator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>,_false,_false>
                   ::operator*(&__end2_2);
    __range3_4 = (vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *)
                 node->_vptr_Rule;
    this_03 = &node->key;
    __end3_4 = std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::begin
                         ((vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *)
                          this_03);
    succ = (Rule **)std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::end
                              ((vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>
                                *)this_03);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_4,
                              (__normal_iterator<llbuild::core::Rule_**,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>
                               *)&succ), bVar2) {
      __k = __gnu_cxx::
            __normal_iterator<llbuild::core::Rule_**,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>
            ::operator*(&__end3_4);
      pmVar7 = std::
               unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
               ::operator[]((unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
                             *)&__range2_2,__k);
      std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::push_back
                (pmVar7,(value_type *)&__range3_4);
      __gnu_cxx::
      __normal_iterator<llbuild::core::Rule_**,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>
      ::operator++(&__end3_4);
    }
    std::__detail::
    _Node_iterator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>,_false,_false>
    ::operator++(&__end2_2);
  }
  __end2_3 = std::
             unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
             ::begin((unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
                      *)&__range2_2);
  entry_1 = (pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>
             *)std::
               unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
               ::end((unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
                      *)&__range2_2);
  while (bVar2 = std::__detail::operator!=
                           (&__end2_3.
                             super__Node_iterator_base<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>,_false>
                            ,(_Node_iterator_base<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>,_false>
                              *)&entry_1), bVar2) {
    ppVar8 = std::__detail::
             _Node_iterator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>,_false,_false>
             ::operator*(&__end2_3);
    iVar9 = std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::begin
                      (&ppVar8->second);
    iVar10 = std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::end
                       (&ppVar8->second);
    std::
    sort<__gnu_cxx::__normal_iterator<llbuild::core::Rule**,std::vector<llbuild::core::Rule*,std::allocator<llbuild::core::Rule*>>>,(anonymous_namespace)::BuildEngineImpl::findCycle(llbuild::core::KeyType_const&)::_lambda(llbuild::core::Rule*,llbuild::core::Rule*)_1_>
              (iVar9._M_current,iVar10._M_current);
    std::__detail::
    _Node_iterator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>,_false,_false>
    ::operator++(&__end2_3);
  }
  std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::vector
            (__return_storage_ptr__);
  std::
  unordered_set<llbuild::core::Rule_*,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<llbuild::core::Rule_*>_>
  ::unordered_set((unordered_set<llbuild::core::Rule_*,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<llbuild::core::Rule_*>_>
                   *)&stack.super__Vector_base<WorkItem,_std::allocator<WorkItem>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  pRVar11 = getRuleInfoForKey(this,buildKey);
  node_00 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::get
                      (&pRVar11->rule);
  (anonymous_namespace)::BuildEngineImpl::findCycle(llbuild::core::KeyType_const&)::WorkItem::
  WorkItem(llbuild::core::Rule__(&local_360,node_00);
  local_350 = &local_360;
  local_348 = 1;
  std::allocator<WorkItem>::allocator((allocator<WorkItem> *)((long)&entry_2 + 7));
  __l._M_len = local_348;
  __l._M_array = local_350;
  std::vector<WorkItem,_std::allocator<WorkItem>_>::vector
            ((vector<WorkItem,_std::allocator<WorkItem>_> *)local_340,__l,
             (allocator_type *)((long)&entry_2 + 7));
  std::allocator<WorkItem>::~allocator((allocator<WorkItem> *)((long)&entry_2 + 7));
  while (bVar2 = std::vector<WorkItem,_std::allocator<WorkItem>_>::empty
                           ((vector<WorkItem,_std::allocator<WorkItem>_> *)local_340),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    __k_00 = std::vector<WorkItem,_std::allocator<WorkItem>_>::back
                       ((vector<WorkItem,_std::allocator<WorkItem>_> *)local_340);
    it_2._8_8_ = std::
                 unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
                 ::operator[]((unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
                               *)&__range2_2,&__k_00->node);
    if (__k_00->predecessorIndex == 0) {
      std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::push_back
                (__return_storage_ptr__,&__k_00->node);
      pVar15 = std::
               unordered_set<llbuild::core::Rule_*,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<llbuild::core::Rule_*>_>
               ::insert((unordered_set<llbuild::core::Rule_*,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<llbuild::core::Rule_*>_>
                         *)&stack.super__Vector_base<WorkItem,_std::allocator<WorkItem>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,&__k_00->node);
      child = (Rule *)pVar15.first.super__Node_iterator_base<llbuild::core::Rule_*,_false>._M_cur;
      local_390 = pVar15.second;
      local_388._M_cur = (__node_type *)child;
      it_2.first.super__Node_iterator_base<llbuild::core::Rule_*,_false>._M_cur._0_1_ = local_390;
      if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
    }
    uVar1 = __k_00->predecessorIndex;
    sVar12 = std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::size
                       ((vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *)
                        it_2._8_8_);
    if (uVar1 == sVar12) {
      std::
      unordered_set<llbuild::core::Rule_*,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<llbuild::core::Rule_*>_>
      ::erase((unordered_set<llbuild::core::Rule_*,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<llbuild::core::Rule_*>_>
               *)&stack.super__Vector_base<WorkItem,_std::allocator<WorkItem>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&__k_00->node);
      std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::pop_back
                (__return_storage_ptr__);
      std::vector<WorkItem,_std::allocator<WorkItem>_>::pop_back
                ((vector<WorkItem,_std::allocator<WorkItem>_> *)local_340);
    }
    else {
      ppRVar13 = std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::
                 operator[]((vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *
                            )it_2._8_8_,(ulong)__k_00->predecessorIndex);
      local_3a0 = *ppRVar13;
      __k_00->predecessorIndex = __k_00->predecessorIndex + 1;
      (anonymous_namespace)::BuildEngineImpl::findCycle(llbuild::core::KeyType_const&)::WorkItem::
      WorkItem(llbuild::core::Rule__(&local_3b0,local_3a0);
      std::
      vector<(anonymous_namespace)::BuildEngineImpl::findCycle(llbuild::core::KeyType_const&)::WorkItem,std::allocator<(anonymous_namespace)::BuildEngineImpl::findCycle(llbuild::core::KeyType_const&)::WorkItem>>
      ::
      emplace_back<(anonymous_namespace)::BuildEngineImpl::findCycle(llbuild::core::KeyType_const&)::WorkItem>
                ((vector<(anonymous_namespace)::BuildEngineImpl::findCycle(llbuild::core::KeyType_const&)::WorkItem,std::allocator<(anonymous_namespace)::BuildEngineImpl::findCycle(llbuild::core::KeyType_const&)::WorkItem>>
                  *)local_340,&local_3b0);
    }
  }
  std::vector<WorkItem,_std::allocator<WorkItem>_>::~vector
            ((vector<WorkItem,_std::allocator<WorkItem>_> *)local_340);
  std::
  unordered_set<llbuild::core::Rule_*,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<llbuild::core::Rule_*>_>
  ::~unordered_set((unordered_set<llbuild::core::Rule_*,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<llbuild::core::Rule_*>_>
                    *)&stack.super__Vector_base<WorkItem,_std::allocator<WorkItem>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  std::
  unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
  ::~unordered_map((unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
                    *)&__range2_2);
  std::
  unordered_set<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::hash<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>,_std::equal_to<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
  ::~unordered_set((unordered_set<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::hash<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>,_std::equal_to<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                    *)&record);
  std::
  vector<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
  ::~vector((vector<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
             *)&__range2);
  std::
  unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
  ::~unordered_map((unordered_map<llbuild::core::Rule_*,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>,_std::hash<llbuild::core::Rule_*>,_std::equal_to<llbuild::core::Rule_*>,_std::allocator<std::pair<llbuild::core::Rule_*const,_std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>_>_>_>
                    *)&activeRuleScanRecords.
                       super__Vector_base<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<const_(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  llbuild::TracingEngineQueueItemEvent::~TracingEngineQueueItemEvent
            ((TracingEngineQueueItemEvent *)&successorGraph._M_h._M_single_bucket);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Rule*> findCycle(const KeyType& buildKey) {
    TracingEngineQueueItemEvent i(EngineQueueItemKind::FindingCycle, buildKey.c_str());

    // Gather all of the successor relationships.
    std::unordered_map<Rule*, std::vector<Rule*>> successorGraph;
    std::vector<const RuleScanRecord *> activeRuleScanRecords;
    for (const auto& it: taskInfos) {
      const TaskInfo& taskInfo = it.second;
      assert(taskInfo.forRuleInfo);
      std::vector<Rule*> successors;
      for (const auto& request: taskInfo.requestedBy) {
        assert(request.taskInfo->forRuleInfo);
        successors.push_back(request.taskInfo->forRuleInfo->rule.get());
      }
      for (const auto& request: taskInfo.deferredScanRequests) {
        // Add the sucessor for the deferred relationship itself.
        successors.push_back(request.ruleInfo->rule.get());
      }
      successorGraph.insert({ taskInfo.forRuleInfo->rule.get(), successors });
    }

    // Add the pending scan records for every rule.
    //
    // NOTE: There is a very subtle condition around this versus adding the ones
    // accessible via the tasks, see https://bugs.swift.org/browse/SR-1948.
    // Unfortunately, we do not have a test case for this!
    for (const auto& it: ruleInfos) {
      const RuleInfo& ruleInfo = it.second;
      if (ruleInfo.isScanning()) {
        const auto* scanRecord = ruleInfo.getPendingScanRecord();
        activeRuleScanRecords.push_back(scanRecord);
      }
    }

    // Gather dependencies from all of the active scan records.
    std::unordered_set<const RuleScanRecord*> visitedRuleScanRecords;
    while (!activeRuleScanRecords.empty()) {
      const auto* record = activeRuleScanRecords.back();
      activeRuleScanRecords.pop_back();

      // Mark the record and ignore it if not scanned.
      if (!visitedRuleScanRecords.insert(record).second)
        continue;

      // For each paused request, add the dependency.
      for (const auto& request: record->pausedInputRequests) {
        if (request.taskInfo) {
          successorGraph[request.inputRuleInfo->rule.get()].push_back(request.taskInfo->forRuleInfo->rule.get());
        }
      }

      // Process the deferred scan requests.
      for (const auto& request: record->deferredScanRequests) {
        // Add the sucessor for the deferred relationship itself.
        successorGraph[request.inputRuleInfo->rule.get()].push_back(request.ruleInfo->rule.get());

        // Add the active rule scan record which needs to be traversed.
        assert(request.ruleInfo->isScanning() || request.ruleInfo->wasForced);
        if (request.ruleInfo->isScanning()) {
          activeRuleScanRecords.push_back(
            request.ruleInfo->getPendingScanRecord());
        }
      }
    }

    // Invert the graph, so we can search from the root.
    std::unordered_map<Rule*, std::vector<Rule*>> predecessorGraph;
    for (auto& entry: successorGraph) {
      Rule* node = entry.first;
      for (auto& succ: entry.second) {
        predecessorGraph[succ].push_back(node);
      }
    }

    // Normalize predecessor order, to ensure a deterministic result (at least,
    // if the graph reaches the same cycle).
    for (auto& entry: predecessorGraph) {
      std::sort(entry.second.begin(), entry.second.end(), [](Rule* a, Rule* b) {
        return a->key < b->key;
      });
    }

    // Find the cycle by searching from the entry node.
    struct WorkItem {
      WorkItem(Rule * node) { this->node = node; }

      Rule* node;
      unsigned predecessorIndex = 0;
    };
    std::vector<Rule*> cycleList;
    std::unordered_set<Rule*> cycleItems;
    std::vector<WorkItem> stack{
      WorkItem{ getRuleInfoForKey(buildKey).rule.get() } };
    while (!stack.empty()) {
      // Take the top item.
      auto& entry = stack.back();
      const auto& predecessors = predecessorGraph[entry.node];

      // If the index is 0, we just started visiting the node.
      if (entry.predecessorIndex == 0) {
        // Push the node on the stack.
        cycleList.push_back(entry.node);
        auto it = cycleItems.insert(entry.node);

        // If the node is already in the stack, we found a cycle.
        if (!it.second)
          break;
      }

      // Visit the next predecessor, if possible.
      if (entry.predecessorIndex != predecessors.size()) {
        auto* child = predecessors[entry.predecessorIndex];
        entry.predecessorIndex += 1;
        stack.emplace_back(WorkItem{ child });
        continue;
      }

      // Otherwise, we are done visiting this node.
      cycleItems.erase(entry.node);
      cycleList.pop_back();
      stack.pop_back();
    }

    return cycleList;
  }